

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::transformed_vertex
          (Fl_PostScript_Graphics_Driver *this,double x,double y)

{
  reconcat(this);
  if (this->gap_ == 0) {
    clocale_printf(this,"%g %g LT\n",x,y);
  }
  else {
    clocale_printf(this,"%g %g MT\n",x,y);
    this->gap_ = 0;
  }
  concat(this);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::transformed_vertex(double x, double y){
  reconcat();
  if(gap_){
    clocale_printf("%g %g MT\n", x , y);
    gap_=0;
  }else
    clocale_printf("%g %g LT\n", x , y);
  concat();
}